

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

void __thiscall
QAbstractFileEngineHandler::~QAbstractFileEngineHandler(QAbstractFileEngineHandler *this)

{
  long lVar1;
  bool bVar2;
  QList<QAbstractFileEngineHandler_*> *this_00;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QAbstractFileEngineHandlerList *handlers;
  QWriteLocker locker;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QWriteLocker *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__QAbstractFileEngineHandler_00be24e8;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>::
  operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
              *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QWriteLocker::QWriteLocker
            (in_stack_ffffffffffffffc0,
             (QReadWriteLock *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if ((qt_abstractfileenginehandlerlist_shutDown & 1U) == 0) {
    this_00 = &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
               ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
                             *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))->
               super_QList<QAbstractFileEngineHandler_*>;
    QList<QAbstractFileEngineHandler*>::removeOne<QAbstractFileEngineHandler*>
              (this_00,(QAbstractFileEngineHandler **)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar2 = QList<QAbstractFileEngineHandler_*>::isEmpty
                      ((QList<QAbstractFileEngineHandler_*> *)0x26d4b1);
    if (bVar2) {
      QBasicAtomicInteger<int>::storeRelaxed
                ((QBasicAtomicInteger<int> *)this_00,in_stack_ffffffffffffffbc);
    }
  }
  QWriteLocker::~QWriteLocker((QWriteLocker *)0x26d4d1);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QAbstractFileEngineHandler::~QAbstractFileEngineHandler()
{
    QWriteLocker locker(fileEngineHandlerMutex());
    // Remove this handler from the handler list only if the list is valid.
    if (!qt_abstractfileenginehandlerlist_shutDown) {
        QAbstractFileEngineHandlerList *handlers = fileEngineHandlers();
        handlers->removeOne(this);
        if (handlers->isEmpty())
            qt_file_engine_handlers_in_use.storeRelaxed(false);
    }
}